

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O2

ExprBase * AnalyzeTypeof(ExpressionContext *ctx,SynTypeof *syntax)

{
  TypeBase *pTVar1;
  TypeBase *pTVar2;
  int iVar3;
  ExprBase *initializer;
  undefined4 extraout_var;
  ExprBase *pEVar4;
  
  initializer = AnalyzeExpression(ctx,syntax->value);
  if (initializer->type == ctx->typeAuto) {
    anon_unknown.dwarf_ff84f::Stop
              (ctx,&syntax->super_SynBase,"ERROR: cannot take typeid from auto type");
  }
  pEVar4 = initializer;
  if (initializer->typeID != 8) {
    ResolveInitializerValue(ctx,&syntax->super_SynBase,initializer);
    if ((initializer->type != (TypeBase *)0x0) && (initializer->type->typeID - 0x1a < 3)) {
      __assert_fail("!isType<TypeArgumentSet>(value->type) && !isType<TypeMemberSet>(value->type) && !isType<TypeFunctionSet>(value->type)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                    ,0x2e00,"ExprBase *AnalyzeTypeof(ExpressionContext &, SynTypeof *)");
    }
    iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
    pEVar4 = (ExprBase *)CONCAT44(extraout_var,iVar3);
    pTVar1 = initializer->type;
    pTVar2 = ctx->typeTypeID;
    pEVar4->typeID = 8;
    pEVar4->source = &syntax->super_SynBase;
    pEVar4->type = pTVar2;
    pEVar4->next = (ExprBase *)0x0;
    pEVar4->listed = false;
    pEVar4->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e3558;
    pEVar4[1]._vptr_ExprBase = (_func_int **)pTVar1;
  }
  return pEVar4;
}

Assistant:

ExprBase* AnalyzeTypeof(ExpressionContext &ctx, SynTypeof *syntax)
{
	ExprBase *value = AnalyzeExpression(ctx, syntax->value);

	if(value->type == ctx.typeAuto)
		Stop(ctx, syntax, "ERROR: cannot take typeid from auto type");

	if(isType<ExprTypeLiteral>(value))
		return value;

	ResolveInitializerValue(ctx, syntax, value);

	assert(!isType<TypeArgumentSet>(value->type) && !isType<TypeMemberSet>(value->type) && !isType<TypeFunctionSet>(value->type));

	return new (ctx.get<ExprTypeLiteral>()) ExprTypeLiteral(syntax, ctx.typeTypeID, value->type);
}